

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::DumbDirectoryDatabase::read_entry
          (DumbDirectoryDatabase *this,ResourceTag tag,Hash hash,size_t *blob_size,void *blob,
          PayloadReadFlags flags)

{
  bool bVar1;
  int iVar2;
  LogLevel LVar3;
  size_t sVar4;
  FILE *__stream;
  ulong __n;
  bool bVar5;
  string path;
  char filename [25];
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  char local_58 [40];
  
  if ((flags & 1) != 0) {
    return false;
  }
  if (this->mode != ReadOnly) {
    return false;
  }
  iVar2 = (*(this->super_DatabaseInterface)._vptr_DatabaseInterface[5])(this);
  if (blob_size == (size_t *)0x0) {
    return false;
  }
  if ((char)iVar2 == '\0') {
    return false;
  }
  sprintf(local_58,"%02x.%016lx.json",(ulong)tag,hash);
  local_78._M_allocated_capacity = (size_type)&local_68;
  sVar4 = strlen(local_58);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,local_58,local_58 + sVar4);
  Path::join((string *)local_98,&this->base_directory,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
  }
  __stream = fopen((char *)local_98._0_8_,"rb");
  if (__stream == (FILE *)0x0) {
    LVar3 = get_thread_log_level();
    if ((int)LVar3 < 3) {
      bVar5 = false;
      bVar1 = Internal::log_thread_callback(LOG_ERROR,"Failed to open file: %s\n",local_98._0_8_);
      if (bVar1) goto LAB_00110d45;
      read_entry((DumbDirectoryDatabase *)local_98);
    }
  }
  else {
    iVar2 = fseek(__stream,0,2);
    if (iVar2 < 0) {
      fclose(__stream);
      LVar3 = get_thread_log_level();
      if ((int)LVar3 < 3) {
        bVar5 = false;
        bVar1 = Internal::log_thread_callback
                          (LOG_ERROR,"Failed to seek in file: %s\n",local_98._0_8_);
        if (bVar1) goto LAB_00110d45;
        read_entry((DumbDirectoryDatabase *)local_98);
      }
    }
    else {
      __n = ftell(__stream);
      rewind(__stream);
      if (blob == (void *)0x0) {
        *blob_size = __n;
LAB_00110d3a:
        fclose(__stream);
        bVar5 = true;
        goto LAB_00110d45;
      }
      if (__n <= *blob_size) {
        *blob_size = __n;
        sVar4 = fread(blob,1,__n,__stream);
        if (sVar4 == __n) goto LAB_00110d3a;
      }
      fclose(__stream);
    }
  }
  bVar5 = false;
LAB_00110d45:
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  return bVar5;
}

Assistant:

bool read_entry(ResourceTag tag, Hash hash, size_t *blob_size, void *blob, PayloadReadFlags flags) override
	{
		if ((flags & PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT) != 0)
			return false;

		if (mode != DatabaseMode::ReadOnly)
			return false;

		if (!has_entry(tag, hash))
			return false;

		if (!blob_size)
			return false;

		char filename[25]; // 2 digits + "." + 16 digits + ".json" + null
		sprintf(filename, "%02x.%016" PRIx64 ".json", static_cast<unsigned>(tag), hash);
		auto path = Path::join(base_directory, filename);

		FILE *file = fopen(path.c_str(), "rb");
		if (!file)
		{
			LOGE_LEVEL("Failed to open file: %s\n", path.c_str());
			return false;
		}

		if (fseek(file, 0, SEEK_END) < 0)
		{
			fclose(file);
			LOGE_LEVEL("Failed to seek in file: %s\n", path.c_str());
			return false;
		}

		size_t file_size = size_t(ftell(file));
		rewind(file);

		if (blob && *blob_size < file_size)
		{
			fclose(file);
			return false;
		}
		*blob_size = file_size;

		if (blob)
		{
			if (fread(blob, 1, file_size, file) != file_size)
			{
				fclose(file);
				return false;
			}
		}

		fclose(file);
		return true;
	}